

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O0

size_t Imf_3_3::calculateBytesPerPixel(Header *header)

{
  bool bVar1;
  int iVar2;
  ChannelList *pCVar3;
  const_iterator x;
  ConstIterator c;
  size_t bytesPerPixel;
  ChannelList *channels;
  const_iterator in_stack_ffffffffffffffd8;
  undefined8 local_18;
  
  pCVar3 = Header::channels((Header *)0x9359f3);
  local_18 = 0;
  x._M_node = (_Base_ptr)ChannelList::begin(in_stack_ffffffffffffffd8._M_node);
  while( true ) {
    in_stack_ffffffffffffffd8._M_node =
         (_Base_ptr)ChannelList::end(in_stack_ffffffffffffffd8._M_node);
    bVar1 = operator!=((ConstIterator *)x._M_node,(ConstIterator *)in_stack_ffffffffffffffd8._M_node
                      );
    if (!bVar1) break;
    ChannelList::ConstIterator::channel((ConstIterator *)0x935a3b);
    iVar2 = pixelTypeSize((PixelType)((ulong)pCVar3 >> 0x20));
    local_18 = (long)iVar2 + local_18;
    ChannelList::ConstIterator::operator++((ConstIterator *)x._M_node);
  }
  return local_18;
}

Assistant:

size_t
calculateBytesPerPixel (const Header& header)
{
    const ChannelList& channels = header.channels ();

    size_t bytesPerPixel = 0;

    for (ChannelList::ConstIterator c = channels.begin (); c != channels.end ();
         ++c)
    {
        bytesPerPixel += pixelTypeSize (c.channel ().type);
    }

    return bytesPerPixel;
}